

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

mspace create_mspace(size_t capacity,int locked)

{
  ulong __len;
  char *tbase_00;
  flag_t local_54;
  size_t local_50;
  char *tbase;
  size_t tsize;
  size_t rs;
  size_t msize;
  mstate m;
  int locked_local;
  size_t capacity_local;
  
  msize = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (capacity < -(mparams.page_size + 0x400)) {
    if (capacity == 0) {
      local_50 = mparams.granularity;
    }
    else {
      local_50 = capacity + 0x400;
    }
    __len = local_50 + (mparams.granularity - 1) & (mparams.granularity - 1 ^ 0xffffffffffffffff);
    tbase_00 = (char *)mmap((void *)0x0,__len,3,0x22,-1,0);
    if (tbase_00 != (char *)0xffffffffffffffff) {
      msize = (size_t)init_user_mstate(tbase_00,__len);
      (((mstate)msize)->seg).sflags = 1;
      if (locked == 0) {
        local_54 = ((mstate)msize)->mflags;
      }
      else {
        local_54 = ((mstate)msize)->mflags;
      }
      ((mstate)msize)->mflags = local_54;
    }
  }
  return (mspace)msize;
}

Assistant:

mspace create_mspace(size_t capacity, int locked) {
  mstate m = 0;
  size_t msize;
  ensure_initialization();
  msize = pad_request(sizeof(struct malloc_state));
  if (capacity < (size_t) -(msize + TOP_FOOT_SIZE + mparams.page_size)) {
    size_t rs = ((capacity == 0)? mparams.granularity :
                 (capacity + TOP_FOOT_SIZE + msize));
    size_t tsize = granularity_align(rs);
    char* tbase = (char*)(CALL_MMAP(tsize));
    if (tbase != CMFAIL) {
      m = init_user_mstate(tbase, tsize);
      m->seg.sflags = USE_MMAP_BIT;
      set_lock(m, locked);
    }
  }
  return (mspace)m;
}